

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O1

FT_Error tt_face_load_hdmx(TT_Face face,FT_Stream stream)

{
  FT_Byte **pbytes;
  FT_Byte FVar1;
  FT_Memory memory;
  ushort uVar2;
  long lVar3;
  FT_Byte *pFVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  FT_Byte *pFVar8;
  ulong uVar9;
  FT_Error error;
  FT_ULong table_size;
  FT_Error local_68;
  uint local_64;
  ulong local_60;
  ulong local_58;
  long local_50;
  FT_Byte *local_48;
  ulong local_40;
  ulong local_38;
  
  memory = stream->memory;
  local_68 = (*face->goto_table)(face,0x68646d78,stream,&local_60);
  if (local_60 < 8 || local_68 != 0) {
    return 0;
  }
  pbytes = &face->hdmx_table;
  local_68 = FT_Stream_ExtractFrame(stream,local_60,pbytes);
  if (local_68 != 0) {
    return local_68;
  }
  pFVar8 = *pbytes;
  uVar5 = (uint)pFVar8[5] << 0x10 | (uint)pFVar8[4] << 0x18;
  uVar7 = 0;
  if (uVar5 != 0xffff0000) {
    uVar7 = (ulong)uVar5;
  }
  if (pFVar8[2] == '\0') {
    uVar2 = (ushort)pFVar8[3];
    uVar6 = (ulong)pFVar8[6] * 0x100 + (ulong)pFVar8[7] | uVar7;
    if ((uVar2 != 0) && (uVar6 - 0x10002 < 0xffffffffffff0002)) goto LAB_00174ab1;
    uVar9 = 0;
    local_64 = (uint)pFVar8[3];
    local_58 = (ulong)pFVar8[7];
    local_50 = (ulong)pFVar8[6] * 0x100;
    local_48 = pFVar8 + local_60;
    local_40 = uVar7;
    local_38 = uVar6;
    pFVar4 = (FT_Byte *)ft_mem_realloc(memory,1,0,(ulong)uVar2,(void *)0x0,&local_68);
    face->hdmx_record_sizes = pFVar4;
    if (local_68 == 0) {
      if (uVar2 != 0) {
        pFVar8 = pFVar8 + 8;
        uVar9 = 0;
        do {
          if (local_48 < pFVar8 + local_40 + local_50 + local_58) goto LAB_00174b7c;
          FVar1 = *pFVar8;
          pFVar8 = pFVar8 + local_38;
          face->hdmx_record_sizes[uVar9] = FVar1;
          uVar9 = uVar9 + 1;
        } while (local_64 != uVar9);
        uVar9 = (ulong)local_64;
      }
LAB_00174b7c:
      face->hdmx_record_count = (FT_UInt)uVar9;
      face->hdmx_table_size = local_60;
      lVar3 = 0x4d8;
      goto LAB_00174aca;
    }
  }
  else {
LAB_00174ab1:
    local_68 = 3;
  }
  FT_Stream_ReleaseFrame(stream,pbytes);
  lVar3 = 0x4c8;
  local_38 = 0;
LAB_00174aca:
  *(ulong *)((long)&(face->root).num_faces + lVar3) = local_38;
  return local_68;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_hdmx( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = stream->memory;
    FT_UInt    nn, num_records;
    FT_ULong   table_size, record_size;
    FT_Byte*   p;
    FT_Byte*   limit;


    /* this table is optional */
    error = face->goto_table( face, TTAG_hdmx, stream, &table_size );
    if ( error || table_size < 8 )
      return FT_Err_Ok;

    if ( FT_FRAME_EXTRACT( table_size, face->hdmx_table ) )
      goto Exit;

    p     = face->hdmx_table;
    limit = p + table_size;

    /* Given that `hdmx' tables are losing its importance (for example, */
    /* variation fonts introduced in OpenType 1.8 must not have this    */
    /* table) we no longer test for a correct `version' field.          */
    p          += 2;
    num_records = FT_NEXT_USHORT( p );
    record_size = FT_NEXT_ULONG( p );

    /* The maximum number of bytes in an hdmx device record is the */
    /* maximum number of glyphs + 2; this is 0xFFFF + 2, thus      */
    /* explaining why `record_size' is a long (which we read as    */
    /* unsigned long for convenience).  In practice, two bytes are */
    /* sufficient to hold the size value.                          */
    /*                                                             */
    /* There are at least two fonts, HANNOM-A and HANNOM-B version */
    /* 2.0 (2005), which get this wrong: The upper two bytes of    */
    /* the size value are set to 0xFF instead of 0x00.  We catch   */
    /* and fix this.                                               */

    if ( record_size >= 0xFFFF0000UL )
      record_size &= 0xFFFFU;

    /* The limit for `num_records' is a heuristic value. */
    if ( num_records > 255              ||
         ( num_records > 0            &&
           ( record_size > 0x10001L ||
             record_size < 4        ) ) )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    if ( FT_NEW_ARRAY( face->hdmx_record_sizes, num_records ) )
      goto Fail;

    for ( nn = 0; nn < num_records; nn++ )
    {
      if ( p + record_size > limit )
        break;

      face->hdmx_record_sizes[nn] = p[0];
      p                          += record_size;
    }

    face->hdmx_record_count = nn;
    face->hdmx_table_size   = table_size;
    face->hdmx_record_size  = record_size;

  Exit:
    return error;

  Fail:
    FT_FRAME_RELEASE( face->hdmx_table );
    face->hdmx_table_size = 0;
    goto Exit;
  }